

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O1

void If_ManSatTest3(void)

{
  uint set;
  sat_solver *s;
  word *pTruth;
  Vec_Int_t *vLits;
  int *piVar1;
  
  s = (sat_solver *)If_ManSatBuildXY(4);
  pTruth = Dau_DsdToTruth("0123456789ABCDEF{abcdef}",6);
  vLits = (Vec_Int_t *)malloc(0x10);
  vLits->nCap = 100;
  vLits->nSize = 0;
  piVar1 = (int *)malloc(400);
  vLits->pArray = piVar1;
  set = If_ManSatCheckXYall_int(s,4,pTruth,6,vLits);
  Dau_DecPrintSet(set,6,1);
  sat_solver_delete(s);
  if (vLits->pArray != (int *)0x0) {
    free(vLits->pArray);
    vLits->pArray = (int *)0x0;
  }
  free(vLits);
  return;
}

Assistant:

void If_ManSatTest3()
{
    int nVars = 6;
    int nLutSize = 4;
    sat_solver * p = (sat_solver *)If_ManSatBuildXY( nLutSize );
//    char * pDsd = "(abcdefg)";
//    char * pDsd = "([a!bc]d!e)";
    char * pDsd = "0123456789ABCDEF{abcdef}";
    word * pTruth = Dau_DsdToTruth( pDsd, nVars );
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
//    unsigned uSet = (1 << 0) | (1 << 2) | (1 << 4) | (1 << 6);
//    unsigned uSet = (3 << 0) | (1 << 2) | (1 << 8) | (1 << 4);
    unsigned uSet = (1 << 0) | (3 << 2) | (1 << 4) | (1 << 6);
    uSet = If_ManSatCheckXYall( p, nLutSize, pTruth, nVars, vLits );
    Dau_DecPrintSet( uSet, nVars, 1 );

    sat_solver_delete(p);
    Vec_IntFree( vLits );
}